

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

ostream * fasttext::utils::operator<<(ostream *out,ClockPrint *me)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _Setw _Var4;
  ostream *poVar5;
  int *in_RSI;
  ostream *in_RDI;
  int32_t etas;
  int32_t etam;
  int32_t etah;
  
  iVar1 = *in_RSI;
  iVar2 = *in_RSI;
  iVar3 = *in_RSI;
  _Var4 = std::setw(3);
  poVar5 = std::operator<<(in_RDI,_Var4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1 / 0xe10);
  poVar5 = std::operator<<(poVar5,"h");
  _Var4 = std::setw(2);
  poVar5 = std::operator<<(poVar5,_Var4);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(int)((long)((ulong)(uint)((int)((long)iVar2 % 0xe10) >> 0x1f) << 0x20
                                         | (long)iVar2 % 0xe10 & 0xffffffffU) / 0x3c));
  std::operator<<(poVar5,"m");
  _Var4 = std::setw(2);
  poVar5 = std::operator<<(in_RDI,_Var4);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(int)((long)((ulong)(uint)((int)((long)iVar3 % 0xe10) >> 0x1f) << 0x20
                                         | (long)iVar3 % 0xe10 & 0xffffffffU) % 0x3c));
  std::operator<<(poVar5,"s");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ClockPrint& me) {
  int32_t etah = me.duration_ / 3600;
  int32_t etam = (me.duration_ % 3600) / 60;
  int32_t etas = (me.duration_ % 3600) % 60;

  out << std::setw(3) << etah << "h" << std::setw(2) << etam << "m";
  out << std::setw(2) << etas << "s";
  return out;
}